

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

void output_example(vw *all,bs *d,example *ec)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int *piVar4;
  int *piVar5;
  float fVar6;
  float fVar7;
  
  shared_data::update(all->sd,ec->test_only,(bool)(-((ec->l).simple.label != 3.4028235e+38) & 1),
                      ec->loss,ec->weight,ec->num_features);
  fVar7 = 3.4028235e+38;
  fVar6 = (ec->l).simple.label;
  if (((fVar6 != 3.4028235e+38) || (NAN(fVar6))) && (ec->test_only == false)) {
    all->sd->weighted_labels = (double)ec->weight * (double)fVar6 + all->sd->weighted_labels;
  }
  piVar4 = (all->final_prediction_sink)._begin;
  piVar5 = (all->final_prediction_sink)._end;
  if (piVar5 != piVar4) {
    d->lb = 3.4028235e+38;
    d->ub = -3.4028235e+38;
    pdVar2 = (d->pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    fVar6 = -3.4028235e+38;
    for (pdVar3 = (d->pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
      dVar1 = *pdVar3;
      if ((double)fVar6 < dVar1) {
        fVar6 = (float)dVar1;
        d->ub = fVar6;
      }
      if (dVar1 < (double)fVar7) {
        fVar7 = (float)dVar1;
        d->lb = fVar7;
      }
    }
    piVar4 = (all->final_prediction_sink)._begin;
    piVar5 = (all->final_prediction_sink)._end;
  }
  for (; piVar4 != piVar5; piVar4 = piVar4 + 1) {
    print_result(*piVar4,(ec->pred).scalar,ec->tag,d->lb,d->ub);
  }
  print_update(all,ec);
  return;
}

Assistant:

void output_example(vw& all, bs& d, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;

  if (all.final_prediction_sink.size() != 0)  // get confidence interval only when printing out predictions
  {
    d.lb = FLT_MAX;
    d.ub = -FLT_MAX;
    for (double v : *d.pred_vec)
    {
      if (v > d.ub)
        d.ub = (float)v;
      if (v < d.lb)
        d.lb = (float)v;
    }
  }

  for (int sink : all.final_prediction_sink) print_result(sink, ec.pred.scalar, ec.tag, d.lb, d.ub);

  print_update(all, ec);
}